

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vl53l1x.cpp
# Opt level: O2

void __thiscall
VL53L1X::VL53L1X(VL53L1X *this,uint8_t port,uint8_t address,int16_t xshutGPIOPin,bool ioMode2v8,
                float *calib,uint timing_budget,uint range_mode,uint timeout)

{
  I2Cgeneric *pIVar1;
  
  VL53LXX::VL53LXX(&this->super_VL53LXX,port,address,xshutGPIOPin,ioMode2v8,calib);
  (this->super_VL53LXX)._vptr_VL53LXX = (_func_int **)&PTR_init_0010dbf8;
  this->timing_budget = timing_budget;
  this->range_mode = range_mode;
  this->io_timeout = (uint16_t)timeout;
  this->did_timeout = false;
  this->calibrated = false;
  this->saved_vhv_init = '\0';
  this->saved_vhv_timeout = '\0';
  this->distance_mode = Unknown;
  pIVar1 = (this->super_VL53LXX).i2c;
  (*pIVar1->_vptr_I2Cgeneric[0x20])(pIVar1,0,0);
  usleep(100);
  pIVar1 = (this->super_VL53LXX).i2c;
  (*pIVar1->_vptr_I2Cgeneric[0x20])(pIVar1,0,1);
  usleep(100);
  return;
}

Assistant:

VL53L1X::VL53L1X(uint8_t port, uint8_t address, const int16_t xshutGPIOPin, bool ioMode2v8, float *calib, unsigned int timing_budget, unsigned int range_mode, unsigned int timeout):
    VL53LXX(port, address, xshutGPIOPin, ioMode2v8, calib)
  , io_timeout(timeout) // timeout, 3s default
  , did_timeout(false)
  , calibrated(false)
  , saved_vhv_init(0)
  , saved_vhv_timeout(0)
  , distance_mode(VL53L1X_DEFINITIONS::Unknown)
  , timing_budget(timing_budget)
  , range_mode(range_mode)
{
  writeReg(VL53L1X_DEFINITIONS::SOFT_RESET, 0x00);
  usleep(100);
  writeReg(VL53L1X_DEFINITIONS::SOFT_RESET, 0x01);
  usleep(100);
}